

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O2

RayDifferential * __thiscall
pbrt::Interaction::SpawnRay(RayDifferential *__return_storage_ptr__,Interaction *this,Vector3f *d)

{
  Float FVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined8 in_XMM0_Qb;
  undefined1 auVar5 [32];
  Point3f PVar6;
  
  PVar6 = OffsetRayOrigin(this,d);
  FVar1 = this->time;
  GetMedium((Interaction *)&(__return_storage_ptr__->super_Ray).medium,(Vector3f *)this);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
  uVar2 = vmovlps_avx(auVar3);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       PVar6.super_Tuple3<pbrt::Point3,_float>.z;
  fVar4 = (d->super_Tuple3<pbrt::Vector3,_float>).y;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
       (d->super_Tuple3<pbrt::Vector3,_float>).x;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = fVar4;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
       (d->super_Tuple3<pbrt::Vector3,_float>).z;
  (__return_storage_ptr__->super_Ray).time = FVar1;
  __return_storage_ptr__->hasDifferentials = false;
  auVar5 = ZEXT1232(ZEXT812(0));
  __return_storage_ptr__->rxOrigin = (Point3f)auVar5._0_12_;
  __return_storage_ptr__->ryOrigin = (Point3f)auVar5._12_12_;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar5._24_4_;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar5._28_4_;
  *(undefined1 (*) [32])&(__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
       auVar5;
  return __return_storage_ptr__;
}

Assistant:

SpawnRay(const Vector3f &d) const {
        return RayDifferential(OffsetRayOrigin(d), d, time, GetMedium(d));
    }